

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

void __thiscall CorUnix::_ThreadNativeWaitData::~_ThreadNativeWaitData(_ThreadNativeWaitData *this)

{
  if (this->fInitialized == true) {
    this->fInitialized = false;
    pthread_cond_destroy((pthread_cond_t *)&this->cond);
    pthread_mutex_destroy((pthread_mutex_t *)this);
    return;
  }
  return;
}

Assistant:

_ThreadNativeWaitData::~_ThreadNativeWaitData()
    {
        if (fInitialized)
        {
            fInitialized = false;
#if !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
            pthread_cond_destroy(&cond);
            pthread_mutex_destroy(&mutex);
#else // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
            close(iPipeRd);
            close(iPipeWr);
#endif // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        }
    }